

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

void Window_To_Buffer(WINDOW_conflict *win,FIELD *field)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int local_3c;
  int local_38;
  int i;
  int width;
  int height;
  int row;
  char *p;
  int len;
  int pad;
  FIELD *field_local;
  WINDOW_conflict *win_local;
  
  p._0_4_ = 0;
  if (((win != (WINDOW_conflict *)0x0) && (field != (FIELD *)0x0)) && (field->buf != (char *)0x0)) {
    iVar1 = field->pad;
    _height = field->buf;
    if (win == (WINDOW_conflict *)0x0) {
      local_3c = -1;
    }
    else {
      local_3c = win->_maxy + 1;
    }
    width = 0;
    while( true ) {
      bVar2 = false;
      if (width < local_3c) {
        bVar2 = width < field->drows;
      }
      if (!bVar2) break;
      wmove(win,width,0);
      iVar3 = winnstr(win,_height + (int)p,field->dcols);
      p._0_4_ = iVar3 + (int)p;
      width = width + 1;
    }
    _height[(int)p] = '\0';
    if (iVar1 != 0x20) {
      for (local_38 = 0; local_38 < (int)p; local_38 = local_38 + 1) {
        if (*_height == iVar1) {
          *_height = ' ';
        }
        _height = _height + 1;
      }
    }
    return;
  }
  __assert_fail("win && field && field->buf",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/form/frm_driver.c"
                ,0x184,"void Window_To_Buffer(WINDOW *, FIELD *)");
}

Assistant:

static void Window_To_Buffer(WINDOW * win, FIELD  * field)
{
  int pad;
  int len = 0;
  char *p;
  int row, height, width;
  
  assert(win && field && field->buf );

  pad = field->pad;
  p = field->buf;
  getmaxyx(win, height, width);

  for(row=0; (row < height) && (row < field->drows); row++ )
    {
      wmove( win, row, 0 );
      len += winnstr( win, p+len, field->dcols );
    }
  p[len] = '\0';

  /* replace visual padding character by blanks in buffer */
  if (pad != C_BLANK)
    {
      int i;
      for(i=0; i<len; i++, p++)
        {
          if (*p==pad) 
            *p = C_BLANK;
        }
    }
}